

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

FT_Error raccess_guess_linux_double_from_file_name
                   (FT_Library library,char *file_name,FT_Long *result_offset)

{
  FT_Error FVar1;
  char *base_file_name;
  FT_Stream stream2;
  FT_Open_Args args2;
  FT_Stream local_68;
  char *local_60;
  FT_Open_Args local_58;
  
  local_58.flags = 4;
  local_58.pathname = file_name;
  FVar1 = FT_Stream_New(library,&local_58,&local_68);
  if (FVar1 == 0) {
    FVar1 = raccess_guess_apple_double(library,local_68,base_file_name,&local_60,result_offset);
    FT_Stream_Free(local_68,0);
  }
  return FVar1;
}

Assistant:

static FT_Error
  raccess_guess_linux_double_from_file_name( FT_Library  library,
                                             char       *file_name,
                                             FT_Long    *result_offset )
  {
    FT_Open_Args  args2;
    FT_Stream     stream2;
    char*         nouse = NULL;
    FT_Error      error;


    args2.flags    = FT_OPEN_PATHNAME;
    args2.pathname = file_name;
    error = FT_Stream_New( library, &args2, &stream2 );
    if ( error )
      return error;

    error = raccess_guess_apple_double( library, stream2, file_name,
                                        &nouse, result_offset );

    FT_Stream_Free( stream2, 0 );

    return error;
  }